

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_unauthorised_basic_auth(lws *wsi)

{
  uchar *buf_00;
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *p;
  char buf [64];
  uchar *local_70;
  uchar local_68 [64];
  
  puVar3 = wsi->context->pt[wsi->tsi].serv_buf;
  buf_00 = puVar3 + 0x10;
  puVar3 = puVar3 + 0x810;
  local_70 = buf_00;
  iVar1 = lws_add_http_header_status(wsi,0x191,&local_70,puVar3);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = lws_snprintf((char *)local_68,0x40,"Basic realm=\"lwsws\"");
    iVar1 = lws_add_http_header_by_token
                      (wsi,WSI_TOKEN_HTTP_WWW_AUTHENTICATE,local_68,iVar1,&local_70,puVar3);
    if (iVar1 == 0) {
      iVar1 = lws_add_http_header_content_length(wsi,0,&local_70,puVar3);
      if (iVar1 == 0) {
        iVar1 = lws_finalize_http_header(wsi,&local_70,puVar3);
        if (iVar1 == 0) {
          iVar1 = lws_write(wsi,buf_00,(long)local_70 - (long)buf_00,
                            LWS_WRITE_CLIENT_IGNORE_XOR_MASK|LWS_WRITE_HTTP_HEADERS);
          if (-1 < iVar1) {
            iVar2 = lws_http_transaction_completed(wsi);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
lws_unauthorised_basic_auth(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	unsigned char *start = pt->serv_buf + LWS_PRE,
		      *p = start, *end = p + 2048;
	char buf[64];
	int n;

	/* no auth... tell him it is required */

	if (lws_add_http_header_status(wsi, HTTP_STATUS_UNAUTHORIZED, &p, end))
		return -1;

	n = lws_snprintf(buf, sizeof(buf), "Basic realm=\"lwsws\"");
	if (lws_add_http_header_by_token(wsi,
			WSI_TOKEN_HTTP_WWW_AUTHENTICATE,
			(unsigned char *)buf, n, &p, end))
		return -1;

	if (lws_add_http_header_content_length(wsi, 0, &p, end))
		return -1;

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	n = lws_write(wsi, start, p - start, LWS_WRITE_HTTP_HEADERS |
					     LWS_WRITE_H2_STREAM_END);
	if (n < 0)
		return -1;

	return lws_http_transaction_completed(wsi);

}